

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::
replaceCurrent(Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
               *this,Expression *expression)

{
  Function *pFVar1;
  Expression *pEVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  size_type sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  Expression *local_38;
  
  pFVar1 = this->currFunction;
  if ((pFVar1 != (Function *)0x0) &&
     (pEVar2 = *this->replacep, (pFVar1->debugLocations)._M_h._M_element_count != 0)) {
    local_38 = expression;
    sVar5 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(pFVar1->debugLocations)._M_h,&local_38);
    if (sVar5 == 0) {
      uVar3 = (pFVar1->debugLocations)._M_h._M_bucket_count;
      uVar7 = (ulong)pEVar2 % uVar3;
      p_Var8 = (pFVar1->debugLocations)._M_h._M_buckets[uVar7];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var8 != (__node_base_ptr)0x0) &&
         (p_Var10 = p_Var8->_M_nxt, p_Var9 = p_Var8,
         (Expression *)p_Var8->_M_nxt[1]._M_nxt != pEVar2)) {
        while (p_Var8 = p_Var10, p_Var10 = p_Var8->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var10[1]._M_nxt % uVar3 != uVar7) ||
             (p_Var9 = p_Var8, (Expression *)p_Var10[1]._M_nxt == pEVar2)) goto LAB_00afbe76;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_00afbe76:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var9->_M_nxt;
      }
      if (p_Var10 != (_Hash_node_base *)0x0) {
        pmVar6 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pFVar1->debugLocations,&local_38);
        p_Var4 = p_Var10[3]._M_nxt;
        *(_Hash_node_base **)
         &(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = p_Var10[2]._M_nxt
        ;
        *(_Hash_node_base **)
         ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = p_Var4;
        *(_Hash_node_base **)
         ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = p_Var10[4]._M_nxt;
      }
    }
  }
  *this->replacep = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      debuginfo::copyOriginalToReplacement(
        getCurrent(), expression, currFunction);
    }
    return *replacep = expression;
  }